

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::RunCheckForUnusedVariables(cmake *this)

{
  Snapshot snapshot;
  bool bVar1;
  bool bVar2;
  pointer ppVar3;
  ostream *poVar4;
  PositionType local_238;
  Snapshot local_228;
  cmListFileBacktrace local_210;
  string local_1e0;
  iterator local_1c0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  local_1b8;
  iterator local_1b0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  local_1a8;
  const_iterator it;
  undefined1 local_190 [8];
  ostringstream msg;
  bool haveUnused;
  cmake *this_local;
  
  bVar1 = false;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::operator<<((ostream *)local_190,"Manually-specified variables were not used by the project:")
  ;
  local_1b0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
       ::begin(&this->UsedCliVariables);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  ::_Rb_tree_const_iterator(&local_1a8,&local_1b0);
  while( true ) {
    local_1c0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
         ::end(&this->UsedCliVariables);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
    ::_Rb_tree_const_iterator(&local_1b8,&local_1c0);
    bVar2 = std::operator!=(&local_1a8,&local_1b8);
    if (!bVar2) break;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
             ::operator->(&local_1a8);
    if ((ppVar3->second & 1U) == 0) {
      bVar1 = true;
      poVar4 = std::operator<<((ostream *)local_190,"\n  ");
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
               ::operator->(&local_1a8);
      std::operator<<(poVar4,(string *)ppVar3);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
    ::operator++(&local_1a8);
  }
  if (bVar1) {
    std::__cxx11::ostringstream::str();
    cmLinkedTree<cmState::SnapshotDataType>::iterator::iterator(&local_238);
    cmState::Snapshot::Snapshot(&local_228,(cmState *)0x0,local_238);
    snapshot.Position.Tree = local_228.Position.Tree;
    snapshot.State = local_228.State;
    snapshot.Position.Position = local_228.Position.Position;
    cmListFileBacktrace::cmListFileBacktrace(&local_210,snapshot);
    IssueMessage(this,WARNING,&local_1e0,&local_210);
    cmListFileBacktrace::~cmListFileBacktrace(&local_210);
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return;
}

Assistant:

void cmake::RunCheckForUnusedVariables()
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  bool haveUnused = false;
  std::ostringstream msg;
  msg << "Manually-specified variables were not used by the project:";
  for(std::map<std::string, bool>::const_iterator
        it = this->UsedCliVariables.begin();
      it != this->UsedCliVariables.end(); ++it)
    {
    if(!it->second)
      {
      haveUnused = true;
      msg << "\n  " << it->first;
      }
    }
  if(haveUnused)
    {
    this->IssueMessage(cmake::WARNING, msg.str());
    }
#endif
}